

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccesscache.cpp
# Opt level: O1

bool __thiscall QNetworkAccessCache::unlinkEntry(QNetworkAccessCache *this,QByteArray *key)

{
  Node *pNVar1;
  Node<QByteArray,_QNetworkAccessCache::Node_*> *pNVar2;
  Node **ppNVar3;
  Node *pNVar4;
  bool bVar5;
  
  if (*(Data<QHashPrivate::Node<QByteArray,_QNetworkAccessCache::Node_*>_> **)(this + 0x10) !=
      (Data<QHashPrivate::Node<QByteArray,_QNetworkAccessCache::Node_*>_> *)0x0) {
    pNVar2 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QNetworkAccessCache::Node_*>_>::
             findNode<QByteArray>
                       (*(Data<QHashPrivate::Node<QByteArray,_QNetworkAccessCache::Node_*>_> **)
                         (this + 0x10),key);
    if (pNVar2 != (Node<QByteArray,_QNetworkAccessCache::Node_*> *)0x0) {
      ppNVar3 = &pNVar2->value;
      goto LAB_0017b507;
    }
  }
  ppNVar3 = (Node **)0x0;
LAB_0017b507:
  if (ppNVar3 == (Node **)0x0) {
    pNVar4 = (Node *)0x0;
  }
  else {
    pNVar4 = *ppNVar3;
  }
  if (pNVar4 == (Node *)0x0) {
    bVar5 = false;
  }
  else {
    bVar5 = pNVar4 == *(Node **)(this + 0x18);
    if (bVar5) {
      *(Node **)(this + 0x18) = pNVar4->next;
    }
    if (pNVar4 == *(Node **)(this + 0x20)) {
      *(Node **)(this + 0x20) = pNVar4->previous;
    }
    pNVar1 = pNVar4->previous;
    if (pNVar1 != (Node *)0x0) {
      pNVar1->next = pNVar4->next;
    }
    if (pNVar4->next != (Node *)0x0) {
      pNVar4->next->previous = pNVar1;
    }
    pNVar4->previous = (Node *)0x0;
    pNVar4->next = (Node *)0x0;
  }
  return bVar5;
}

Assistant:

bool QNetworkAccessCache::unlinkEntry(const QByteArray &key)
{
    Node * const node = hash.value(key);
    if (!node)
        return false;

    bool wasFirst = false;
    if (node == firstExpiringNode) {
        firstExpiringNode = node->next;
        wasFirst = true;
    }
    if (node == lastExpiringNode)
        lastExpiringNode = node->previous;
    if (node->previous)
        node->previous->next = node->next;
    if (node->next)
        node->next->previous = node->previous;

    node->next = node->previous = nullptr;
    return wasFirst;
}